

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalReference.cpp
# Opt level: O0

HierarchicalReference * __thiscall
slang::ast::HierarchicalReference::join
          (HierarchicalReference *this,Compilation *compilation,HierarchicalReference *other)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  HierarchicalReference *pHVar3;
  undefined8 *in_RDX;
  EVP_PKEY_CTX *src;
  span<slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *__s;
  EVP_PKEY_CTX *in_RSI;
  long in_RDI;
  SmallVector<slang::ast::HierarchicalReference::Element,_2UL> newPath;
  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> otherPath;
  HierarchicalReference result;
  HierarchicalReference *in_stack_fffffffffffffee8;
  HierarchicalReference *in_stack_fffffffffffffef0;
  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>
  *in_stack_fffffffffffffef8;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> *in_stack_ffffffffffffff00;
  SmallVectorBase<slang::ast::HierarchicalReference::Element> local_b8;
  span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> local_60;
  pointer local_50;
  size_t local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_20;
  undefined8 *local_18;
  EVP_PKEY_CTX *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  HierarchicalReference(in_stack_fffffffffffffef0);
  local_40 = *local_18;
  local_38 = local_18[1];
  local_20 = *(undefined8 *)(in_RDI + 0x20);
  local_50 = (pointer)local_18[2];
  local_48 = local_18[3];
  bVar1 = isViaIfacePort(in_stack_fffffffffffffef0);
  if (bVar1) {
    local_60 = std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>::
               subspan((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>
                        *)in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8,
                       (size_type)in_stack_fffffffffffffef0);
    local_50 = local_60._M_ptr;
    local_48 = local_60._M_extent._M_extent_value;
  }
  SmallVector<slang::ast::HierarchicalReference::Element,_2UL>::SmallVector
            ((SmallVector<slang::ast::HierarchicalReference::Element,_2UL> *)0x8deeec);
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::
  append_range<std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  SmallVectorBase<slang::ast::HierarchicalReference::Element>::
  append_range<std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>_>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  iVar2 = SmallVectorBase<slang::ast::HierarchicalReference::Element>::copy(&local_b8,local_10,src);
  std::span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL>::
  span<slang::ast::HierarchicalReference::Element,_18446744073709551615UL>
            ((span<const_slang::ast::HierarchicalReference::Element,_18446744073709551615UL> *)
             CONCAT44(extraout_var,iVar2),__s);
  pHVar3 = BumpAllocator::
           emplace<slang::ast::HierarchicalReference,slang::ast::HierarchicalReference&>
                     ((BumpAllocator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  SmallVector<slang::ast::HierarchicalReference::Element,_2UL>::~SmallVector
            ((SmallVector<slang::ast::HierarchicalReference::Element,_2UL> *)0x8def89);
  return pHVar3;
}

Assistant:

const HierarchicalReference& HierarchicalReference::join(Compilation& compilation,
                                                         const HierarchicalReference& other) const {
    HierarchicalReference result;
    result.target = other.target;
    result.expr = other.expr;
    result.upwardCount = upwardCount;

    auto otherPath = other.path;
    if (other.isViaIfacePort())
        otherPath = otherPath.subspan(1);

    SmallVector<Element> newPath;
    newPath.append_range(path);
    newPath.append_range(otherPath);
    result.path = newPath.copy(compilation);

    return *compilation.emplace<HierarchicalReference>(result);
}